

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSet.cpp
# Opt level: O1

shared_ptr<DataSet> __thiscall DataSet::fromFile(DataSet *this,string *file_name)

{
  DataSet *this_00;
  pointer pFVar1;
  runtime_error *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  shared_ptr<DataSet> sVar5;
  size_t size;
  vector<float,_std::allocator<float>_> vec;
  ifstream file;
  allocator_type local_269;
  size_type local_268;
  pointer local_260;
  DataSet *local_258;
  vector<float,_std::allocator<float>_> local_250;
  long local_238 [4];
  int aiStack_218 [122];
  
  this->num_features = 0;
  pFVar1 = (pointer)operator_new(0x30);
  *(pointer *)
   ((long)&(pFVar1->values).super__Vector_base<float,_std::allocator<float>_>._M_impl + 8) =
       (pointer)0x100000001;
  *(undefined ***)&(pFVar1->values).super__Vector_base<float,_std::allocator<float>_>._M_impl =
       &PTR___Sp_counted_ptr_inplace_00109cd8;
  this_00 = (DataSet *)
            ((long)&(pFVar1->values).super__Vector_base<float,_std::allocator<float>_>._M_impl +
            0x10);
  *(pointer *)
   ((long)&(pFVar1->values).super__Vector_base<float,_std::allocator<float>_>._M_impl + 0x10) =
       (pointer)0x1;
  *(undefined8 *)&pFVar1[1].values.super__Vector_base<float,_std::allocator<float>_>._M_impl = 0;
  *(pointer *)
   ((long)&pFVar1[1].values.super__Vector_base<float,_std::allocator<float>_>._M_impl + 8) =
       (pointer)0x0;
  *(pointer *)
   ((long)&pFVar1[1].values.super__Vector_base<float,_std::allocator<float>_>._M_impl + 0x10) =
       (pointer)0x0;
  (this->vectors).super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>._M_impl.
  super__Vector_impl_data._M_start = pFVar1;
  this->num_features = (size_t)this_00;
  std::ifstream::ifstream(local_238,(string *)file_name,_S_bin);
  if (*(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18)) == 0) {
    local_258 = this;
    std::istream::read((char *)local_238,(long)this_00);
    std::istream::read((char *)local_238,(long)&local_268);
    std::vector<FeatureVec,_std::allocator<FeatureVec>_>::reserve
              ((vector<FeatureVec,_std::allocator<FeatureVec>_> *)(pFVar1 + 1),local_268);
    local_260 = pFVar1;
    if (local_268 != 0) {
      uVar4 = 0;
      do {
        std::vector<float,_std::allocator<float>_>::vector
                  (&local_250,this_00->num_features,&local_269);
        if (this_00->num_features != 0) {
          lVar2 = 0;
          uVar3 = 0;
          do {
            std::istream::read((char *)local_238,
                               (long)local_250.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar2);
            uVar3 = uVar3 + 1;
            lVar2 = lVar2 + 4;
          } while (uVar3 < this_00->num_features);
        }
        addVector(this_00,&local_250);
        if (local_250.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_250.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < local_268);
    }
    std::ifstream::~ifstream(local_238);
    sVar5.super___shared_ptr<DataSet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar5.super___shared_ptr<DataSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_258;
    return (shared_ptr<DataSet>)sVar5.super___shared_ptr<DataSet,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"Could not load from file");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<DataSet> DataSet::fromFile(const std::string &file_name) {
  auto ds = std::make_shared<DataSet>();

  std::ifstream file(file_name, std::ios::binary);

  if (file.good()) {
    // Read num features
    file.read((char *) &ds->num_features, sizeof(size_t));
    size_t size;
    // Read number of vectors
    file.read((char *) &size, sizeof(size_t));
    ds->vectors.reserve(size);
    for (size_t v = 0; v < size; v++) {
      std::vector<float> vec(ds->num_features);
      for (size_t f = 0; f < ds->num_features; f++) {
        file.read((char *) &vec[f], sizeof(float));
      }
      ds->addVector(vec);
    }
    return ds;
  } else {
    throw std::runtime_error("Could not load from file");
  }

}